

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullable.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnNullable::Append(ColumnNullable *this,ColumnRef *column)

{
  bool bVar1;
  byte bVar2;
  element_type *peVar3;
  element_type *__r;
  shared_ptr<clickhouse::ColumnNullable> col;
  Column *in_stack_ffffffffffffff48;
  shared_ptr<clickhouse::Column> *in_stack_ffffffffffffff50;
  shared_ptr<clickhouse::Column> *this_00;
  undefined6 in_stack_ffffffffffffff68;
  undefined1 in_stack_ffffffffffffff6e;
  undefined1 in_stack_ffffffffffffff6f;
  shared_ptr<clickhouse::Column> local_78;
  TypeRef *in_stack_ffffffffffffff98;
  Type *in_stack_ffffffffffffffa0;
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x2124a6);
  Column::As<clickhouse::ColumnNullable>
            ((Column *)
             CONCAT17(in_stack_ffffffffffffff6f,
                      CONCAT16(in_stack_ffffffffffffff6e,in_stack_ffffffffffffff68)));
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    std::__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x2124d9);
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x2124e5);
    Column::Type(in_stack_ffffffffffffff48);
    std::__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<clickhouse::Type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x212504);
    std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x212517);
    Column::Type(in_stack_ffffffffffffff48);
    bVar1 = Type::IsEqual(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar2 = bVar1 ^ 0xff;
    std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x21254f);
    std::shared_ptr<clickhouse::Type>::~shared_ptr((shared_ptr<clickhouse::Type> *)0x21255c);
    if ((bVar2 & 1) == 0) {
      peVar3 = std::
               __shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x2125d7);
      std::__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x2125e9);
      std::shared_ptr<clickhouse::Column>::shared_ptr
                (in_stack_ffffffffffffff50,
                 (shared_ptr<clickhouse::Column> *)in_stack_ffffffffffffff48);
      (*peVar3->_vptr_Column[2])(peVar3,&stack0xffffffffffffff98);
      std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x21261e);
      __r = std::
            __shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<clickhouse::ColumnVector<unsigned_char>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x21262c);
      std::__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
      ::operator->((__shared_ptr_access<clickhouse::ColumnNullable,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x21263d);
      this_00 = &local_78;
      std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnVector<unsigned_char>,void>
                (this_00,(shared_ptr<clickhouse::ColumnVector<unsigned_char>_> *)__r);
      (*(__r->super_Column)._vptr_Column[2])(__r,this_00);
      std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x212671);
    }
  }
  std::shared_ptr<clickhouse::ColumnNullable>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnNullable> *)0x2126c2);
  return;
}

Assistant:

void ColumnNullable::Append(ColumnRef column) {
    if (auto col = column->As<ColumnNullable>()) {
        if (!col->nested_->Type()->IsEqual(nested_->Type())) {
            return;
        }

        nested_->Append(col->nested_);
        nulls_->Append(col->nulls_);
    }
}